

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  TypeBase *in_R9;
  
  uVar1 = this->bucketCount;
  uVar3 = (*key)->nameHash;
  uVar2 = 0;
  do {
    bVar4 = (byte)in_R9;
    if (uVar1 == uVar2) {
LAB_001ea590:
      return (bool)(uVar2 < uVar1 & bVar4);
    }
    uVar3 = uVar3 & uVar1 - 1;
    in_R9 = this->data[uVar3];
    if (in_R9 == (TypeBase *)0x0) {
      bVar4 = 0;
      goto LAB_001ea590;
    }
    if (in_R9 == *key) {
      bVar4 = 1;
      goto LAB_001ea590;
    }
    uVar3 = uVar3 + uVar2 + 1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}